

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

ParamIteratorInterface<void_(*)(const_unsigned_char_*,_const_short_*,_unsigned_short,_unsigned_char,_unsigned_char,_signed_char_*)>
* __thiscall
testing::internal::
ValuesInIteratorRangeGenerator<void_(*)(const_unsigned_char_*,_const_short_*,_unsigned_short,_unsigned_char,_unsigned_char,_signed_char_*)>
::Iterator::Clone(Iterator *this)

{
  ParamIteratorInterface<void_(*)(const_unsigned_char_*,_const_short_*,_unsigned_short,_unsigned_char,_unsigned_char,_signed_char_*)>
  *pPVar1;
  
  pPVar1 = (ParamIteratorInterface<void_(*)(const_unsigned_char_*,_const_short_*,_unsigned_short,_unsigned_char,_unsigned_char,_signed_char_*)>
            *)operator_new(0x20);
  pPVar1->_vptr_ParamIteratorInterface = (_func_int **)&PTR__Iterator_00f4c188;
  pPVar1[1]._vptr_ParamIteratorInterface = (_func_int **)this->base_;
  pPVar1[2]._vptr_ParamIteratorInterface = (_func_int **)(this->iterator_)._M_current;
  pPVar1[3]._vptr_ParamIteratorInterface = (_func_int **)0x0;
  return pPVar1;
}

Assistant:

ParamIteratorInterface<T>* Clone() const override {
      return new Iterator(*this);
    }